

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::AddConstraintInfo::Copy(AddConstraintInfo *this)

{
  pointer pCVar1;
  AlterInfo *in_RSI;
  _Head_base<0UL,_duckdb::Constraint_*,_false> local_80;
  AlterEntryData local_78;
  
  AlterInfo::GetAlterEntryData(&local_78,in_RSI);
  pCVar1 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::operator->
                     ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                       *)(in_RSI + 1));
  (*pCVar1->_vptr_Constraint[3])(&local_80,pCVar1);
  make_uniq_base<duckdb::AlterInfo,duckdb::AddConstraintInfo,duckdb::AlterEntryData,duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
            ((duckdb *)this,&local_78,
             (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
             &local_80);
  if (local_80._M_head_impl != (Constraint *)0x0) {
    (*(local_80._M_head_impl)->_vptr_Constraint[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
    operator_delete(local_78.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.schema._M_dataplus._M_p != &local_78.schema.field_2) {
    operator_delete(local_78.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.catalog._M_dataplus._M_p != &local_78.catalog.field_2) {
    operator_delete(local_78.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> AddConstraintInfo::Copy() const {
	return make_uniq_base<AlterInfo, AddConstraintInfo>(GetAlterEntryData(), constraint->Copy());
}